

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O1

void stackjit::Amd64Backend::divRegFromRegUnsigned
               (CodeGen *codeGen,Registers dest,Registers src,bool is32bits)

{
  pointer *ppuVar1;
  iterator iVar2;
  undefined8 in_RAX;
  undefined7 in_register_00000031;
  undefined8 uStack_18;
  
  if ((int)CONCAT71(in_register_00000031,dest) == 0) {
    uStack_18 = in_RAX;
    if (!is32bits) {
      uStack_18._0_7_ = (undefined7)in_RAX;
      uStack_18 = CONCAT17(0x48,(undefined7)uStack_18);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (codeGen,iVar2,(uchar *)((long)&uStack_18 + 7));
      }
      else {
        *iVar2._M_current = 'H';
        ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    uStack_18._0_7_ = CONCAT16(0xf7,(undefined6)uStack_18);
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,(uchar *)((long)&uStack_18 + 6));
    }
    else {
      *iVar2._M_current = 0xf7;
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    uStack_18 = CONCAT26(uStack_18._6_2_,CONCAT15(src,(undefined5)uStack_18)) | 0xf00000000000;
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,(uchar *)((long)&uStack_18 + 5));
    }
    else {
      *iVar2._M_current = src | 0xf0;
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    return;
  }
  __assert_fail("dest == Registers::AX && \"Only the AX register is supported as dest.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/compiler/x64/amd64.cpp"
                ,0x447,
                "void stackjit::Amd64Backend::divRegFromRegUnsigned(CodeGen &, Registers, Registers, bool)"
               );
}

Assistant:

void Amd64Backend::divRegFromRegUnsigned(CodeGen& codeGen, Registers dest, Registers src, bool is32bits) {
		assert(dest == Registers::AX && "Only the AX register is supported as dest.");

		if (!is32bits) {
			codeGen.push_back(0x48);
		}

		codeGen.push_back(0xf7);
		codeGen.push_back(0xf0 | (Byte)src);
	}